

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

string * __thiscall project::get_apple_osx_config_abi_cxx11_(project *this)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  reference pbVar5;
  reference pbVar6;
  long in_RSI;
  string *in_RDI;
  buildExport *in_stack_000000c0;
  string *in_stack_000000c8;
  project *in_stack_000000d0;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *library;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *framework;
  iterator __end1;
  iterator __begin1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  buildExport b;
  stringstream ss;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa38;
  buildExport *in_stack_fffffffffffffa40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa50;
  int local_4dc;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  map_t *in_stack_fffffffffffffb40;
  project *in_stack_fffffffffffffb48;
  _Self local_4b0;
  _Self local_4a8;
  undefined1 local_4a0 [24];
  undefined1 *local_488;
  int local_47c;
  string *local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  undefined1 *local_460;
  string *local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_450;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_448;
  undefined1 *local_440;
  undefined4 local_434;
  allocator local_42d [20];
  allocator local_419;
  string local_418 [32];
  byte local_3f8;
  string local_380 [312];
  undefined1 auStack_248 [24];
  undefined1 auStack_230 [152];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  buildExport::buildExport(in_stack_fffffffffffffa40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"XCODE_MAC",&local_419);
  get_export(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  if ((local_3f8 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",local_42d);
    std::allocator<char>::~allocator((allocator<char> *)local_42d);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Using XCode Config");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_fffffffffffffa50);
    if (!bVar2) {
      poVar3 = std::operator<<(local_188,"            target_include_directories(");
      poVar3 = std::operator<<(poVar3,(string *)(in_RSI + 0x158));
      std::operator<<(poVar3," PUBLIC\n");
      local_440 = auStack_248;
      local_448._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffa38);
      local_450 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa38);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffa40,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffa38);
        if (!bVar2) break;
        local_458 = (string *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_448);
        poVar3 = std::operator<<(local_188,"                ${CMAKE_SYSROOT}/");
        poVar3 = std::operator<<(poVar3,local_458);
        std::operator<<(poVar3,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_448);
      }
      std::operator<<(local_188,"            )\n");
      std::operator<<(local_188,"\n");
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar3 = std::operator<<(local_188,"            target_compile_options(");
      poVar3 = std::operator<<(poVar3,(string *)(in_RSI + 0x158));
      poVar3 = std::operator<<(poVar3," PUBLIC ");
      poVar3 = std::operator<<(poVar3,local_380);
      std::operator<<(poVar3,")\n");
      std::operator<<(local_188,"\n");
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_fffffffffffffa50);
    if (!bVar2) {
      poVar3 = std::operator<<(local_188,"            target_link_directories(");
      poVar3 = std::operator<<(poVar3,(string *)(in_RSI + 0x158));
      std::operator<<(poVar3," BEFORE PUBLIC\n");
      local_460 = auStack_230;
      local_468._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffa38);
      local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa38);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffa40,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffa38);
        if (!bVar2) break;
        local_478 = (string *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_468);
        poVar3 = std::operator<<(local_188,"                ${CMAKE_SYSROOT}/");
        poVar3 = std::operator<<(poVar3,local_478);
        std::operator<<(poVar3,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_468);
      }
      std::operator<<(local_188,"            )\n");
      std::operator<<(local_188,"\n");
    }
    local_47c = 0;
    get_libraries(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    local_488 = local_4a0;
    local_4a8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffa38);
    local_4b0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffffa38);
    while( true ) {
      bVar2 = std::operator!=(&local_4a8,&local_4b0);
      if (!bVar2) break;
      pbVar5 = std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x10fd82);
      poVar3 = std::operator<<(local_188,"            find_library(FRAMEWORK");
      iVar1 = local_47c;
      local_47c = local_47c + 1;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::operator<<(poVar3,")\n");
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_4a8);
    }
    local_434 = 6;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x10fd70);
    std::operator<<(local_188,"\n");
    poVar3 = std::operator<<(local_188,"            target_link_libraries(");
    poVar3 = std::operator<<(poVar3,(string *)(in_RSI + 0x158));
    std::operator<<(poVar3,"\n");
    local_4c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffa38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffa38);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffa40,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffa38);
      if (!bVar2) break;
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_4c8);
      poVar3 = std::operator<<(local_188,"                ");
      poVar3 = std::operator<<(poVar3,(string *)pbVar6);
      std::operator<<(poVar3,"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_4c8);
    }
    for (local_4dc = 0; local_4dc < local_47c; local_4dc = local_4dc + 1) {
      poVar3 = std::operator<<(local_188,"                ${FRAMEWORK");
      in_stack_fffffffffffffa40 = (buildExport *)std::ostream::operator<<(poVar3,local_4dc);
      std::operator<<((ostream *)in_stack_fffffffffffffa40,"}\n");
    }
    std::operator<<(local_188,"            )\n");
    std::__cxx11::stringstream::str();
  }
  local_434 = 1;
  buildExport::~buildExport(in_stack_fffffffffffffa40);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string project::get_apple_osx_config()
{
    std::stringstream ss;

    project::buildExport b;
    get_export("XCODE_MAC", b);
    if(!b.valid)
    {
        return "";
    }
    std::cout << "Using XCode Config" << std::endl;

    if(!b.debug.headerPath.empty())
    {
        ss << "            target_include_directories(" << name << " PUBLIC\n";
        for(auto const& path : b.debug.headerPath)
        {
            ss << "                ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "            )\n";
        ss << "\n";
    }

    if(!b.extraCompilerFlags.empty())
    {
        ss << "            target_compile_options(" << name << " PUBLIC " << b.extraCompilerFlags << ")\n";
        ss << "\n";
    }

    if(!b.debug.libraryPath.empty())
    {
        ss << "            target_link_directories(" << name << " BEFORE PUBLIC\n";
        for(auto const& path : b.debug.libraryPath)
        {
            ss << "                ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "            )\n";
        ss << "\n";
    }

    int count = 0;
    for(auto const& framework : get_libraries(OSXFramework))
    {
        ss << "            find_library(FRAMEWORK" << count++ << " " << framework << ")\n";
    }
    ss << "\n";
    ss << "            target_link_libraries(" << name << "\n";
    for(auto const& library : b.externalLibraries)
    {
        ss << "                " << library << "\n";
    }
    for(int i = 0; i < count; i++)
    {
        ss << "                ${FRAMEWORK" << i <<  "}\n";
    }
    ss << "            )\n";

    return ss.str();
}